

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_Update_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_State_Update_PDU::Entity_State_Update_PDU(Entity_State_Update_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Entity_State_Update_PDU_00222928;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EntityID);
  this->m_ui8Padding1 = '\0';
  this->m_ui8NumOfVariableParams = '\0';
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearVelocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_EntityLocation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_EntityOrientation);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EntityAppearance);
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = 'C';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x48;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Entity_State_Update_PDU::Entity_State_Update_PDU() :
    m_ui8Padding1( 0 ),
    m_ui8NumOfVariableParams( 0 )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = EntityStateUpdate_PDU_Type;
    m_ui16PDULength = ENTITY_STATE_UPDATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}